

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O2

void initGlobalPermute(void)

{
  int *piVar1;
  ulong uVar2;
  unsigned_long uVar3;
  ulong uVar4;
  
  if (booleanOptions[2] == 0) {
    globalPermute = getIdentityFromZero(numOfVariables + 1);
  }
  else {
    piVar1 = getRandomFromOne(numOfVariables);
    uVar4 = 0;
    uVar2 = (ulong)(uint)numOfVariables;
    uVar3 = next;
    globalPermute = piVar1;
    if (numOfVariables < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      uVar3 = uVar3 * 0x41c64e6d + 0x3039;
      next = uVar3;
      if (((uint)uVar3 >> 0x10 & 1) != 0) {
        piVar1[uVar4 + 1] = -piVar1[uVar4 + 1];
      }
    }
  }
  return;
}

Assistant:

void initGlobalPermute()
{
    int v;

    if (booleanOptions[REORDER])
    {
        globalPermute = getRandomFromOne (numOfVariables);
        for (v=1;v<=numOfVariables;v++)
            if (myrand() % 2 ==1 )
                globalPermute[v] = -globalPermute[v];
    }
    else
        globalPermute = getIdentityFromZero (numOfVariables+1);

}